

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.hpp
# Opt level: O3

void __thiscall
kainjow::mustache::
parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::parse
          (parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *input,
          context_internal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *ctx,component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *root_component,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *error_message)

{
  component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pcVar1;
  pointer pcVar2;
  pointer pcVar3;
  context_internal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pcVar4;
  pointer pbVar5;
  bool bVar6;
  int iVar7;
  walk_control wVar8;
  long *plVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  delimiter_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pdVar11;
  ostream *poVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  undefined8 uVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  ulong uVar15;
  component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *child
  ;
  component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pcVar16;
  pointer pbVar17;
  pointer pcVar18;
  ulong uVar19;
  size_type sVar20;
  long lVar21;
  initializer_list<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  string_size_type input_position;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> tag_contents;
  vector<unsigned_long,_std::allocator<unsigned_long>_> section_starts;
  vector<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
  sections;
  component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> comp;
  string_size_type current_text_position;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> current_text;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> brace_delimiter_end_unescaped;
  anon_class_24_3_f3e5c141 process_current_text;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  whitespace;
  component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> comp_1
  ;
  bool local_379;
  pointer local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_370;
  undefined4 local_364;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_340;
  delimiter_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_338;
  component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_330;
  void *local_328;
  iterator iStack_320;
  unsigned_long *local_318;
  vector<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
  local_308;
  undefined1 local_2f0 [88];
  element_type *local_298;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_290;
  vector<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_288;
  component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_268;
  context_internal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_260;
  parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_258;
  pointer local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  long *local_208 [2];
  long local_1f8 [2];
  component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_1e8;
  component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_1e0;
  anon_class_24_3_f3e5c141 local_1d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c0;
  _Any_data local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_158;
  undefined8 local_150;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_148;
  undefined1 local_140 [8];
  undefined1 auStack_138 [16];
  component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_128 [2];
  component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_118;
  
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  local_340 = error_message;
  local_258 = this;
  std::__cxx11::string::_M_construct((ulong)&local_228,'\x03');
  pcVar16 = (component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)input->_M_string_length;
  local_338 = &ctx->delim_set;
  local_370 = input;
  local_379 = delimiter_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::is_default(local_338);
  __l._M_len = 1;
  __l._M_array = (iterator)&local_1a8;
  local_1a8._M_unused._M_object = root_component;
  Catch::clara::std::
  vector<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
  ::vector(&local_308,__l,(allocator_type *)local_2f0);
  local_318 = (unsigned_long *)0x0;
  local_328 = (void *)0x0;
  iStack_320._M_current = (unsigned_long *)0x0;
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  local_248._M_string_length = 0;
  local_248.field_2._M_local_buf[0] = '\0';
  local_250 = (component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)0xffffffffffffffff;
  local_330 = pcVar16;
  local_1e8 = root_component;
  std::__cxx11::string::reserve((ulong)&local_248);
  local_1d8.current_text_position = (string_size_type *)&local_250;
  local_2f0._0_8_ = local_2f0 + 0x10;
  local_1d8.current_text = &local_248;
  local_1d8.sections = &local_308;
  std::__cxx11::string::_M_construct((ulong)local_2f0,'\x01');
  local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_360,'\x01');
  pdVar11 = local_338;
  uVar19 = 0xf;
  if ((undefined1 *)local_2f0._0_8_ != local_2f0 + 0x10) {
    uVar19 = CONCAT71(local_2f0._17_7_,local_2f0[0x10]);
  }
  if (uVar19 < local_360._M_string_length + local_2f0._8_8_) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._M_dataplus._M_p != &local_360.field_2) {
      uVar14 = local_360.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_360._M_string_length + local_2f0._8_8_) goto LAB_001db63b;
    plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_360,0,(char *)0x0,local_2f0._0_8_);
  }
  else {
LAB_001db63b:
    plVar9 = (long *)std::__cxx11::string::_M_append(local_2f0,(ulong)local_360._M_dataplus._M_p);
  }
  local_1a8._M_unused._M_object = &local_198;
  pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(plVar9 + 2);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar9 == pbVar13) {
    local_198._M_dataplus._M_p = (pbVar13->_M_dataplus)._M_p;
    local_198._M_string_length = plVar9[3];
  }
  else {
    local_198._M_dataplus._M_p = (pbVar13->_M_dataplus)._M_p;
    local_1a8._M_unused._M_object =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar9;
  }
  local_1a8._8_8_ = plVar9[1];
  *plVar9 = (long)pbVar13;
  plVar9[1] = 0;
  *(undefined1 *)&(pbVar13->_M_dataplus)._M_p = 0;
  local_198.field_2._M_allocated_capacity = (size_type)&local_178;
  std::__cxx11::string::_M_construct((ulong)&local_198.field_2,'\x01');
  local_178.field_2._M_allocated_capacity = (size_type)&_Stack_158;
  std::__cxx11::string::_M_construct((ulong)&local_178.field_2,'\x01');
  _Stack_148._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_138;
  std::__cxx11::string::_M_construct((ulong)&_Stack_148,'\x01');
  pcVar16 = &local_118;
  local_128[0] = pcVar16;
  std::__cxx11::string::_M_construct((ulong)local_128,'\x01');
  __l_00._M_len = 5;
  __l_00._M_array = (iterator)&local_1a8;
  Catch::clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1c0,__l_00,(allocator_type *)local_208);
  lVar21 = -0xa0;
  do {
    pcVar1 = pcVar16[-1].children.
             super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (pcVar16 != pcVar1) {
      operator_delete(pcVar1,(ulong)((pcVar16->text)._M_dataplus._M_p + 1));
    }
    pcVar16 = (component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&pcVar16[-1].children;
    lVar21 = lVar21 + 0x20;
  } while (lVar21 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
  }
  pbVar13 = local_370;
  if ((undefined1 *)local_2f0._0_8_ != local_2f0 + 0x10) {
    operator_delete((void *)local_2f0._0_8_,CONCAT71(local_2f0._17_7_,local_2f0[0x10]) + 1);
  }
  local_378 = (component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)0x0;
  if (local_330 !=
      (component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
      )0x0) {
    local_1e0 = (component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)((long)&local_330[-1].position + 6);
    local_268 = &(ctx->delim_set).end;
    local_260 = ctx;
    do {
      iVar7 = std::__cxx11::string::compare
                        ((ulong)pbVar13,(ulong)local_378,
                         (string *)(ctx->delim_set).begin._M_string_length);
      pbVar5 = local_1c0.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pbVar17 = local_1c0.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (iVar7 == 0) {
        parse::anon_class_24_3_f3e5c141::operator()(&local_1d8);
        pbVar13 = local_370;
        pcVar18 = local_378;
        sVar20 = (ctx->delim_set).begin._M_string_length;
        uVar19 = (long)&(local_378->text)._M_dataplus._M_p + sVar20;
        if ((local_379 & local_378 != local_1e0) == 0) {
LAB_001db911:
          sVar20 = (ctx->delim_set).end._M_string_length;
          local_364 = 0;
          pbVar10 = local_268;
        }
        else {
          uVar15 = local_370->_M_string_length;
          if (uVar15 <= uVar19) {
LAB_001dc12f:
            uVar14 = std::__throw_out_of_range_fmt
                               ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)"
                                ,uVar19,uVar15);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8._M_pod_data);
            std::ios_base::~ios_base((ios_base *)auStack_138);
            Catch::clara::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_1c0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_248._M_dataplus._M_p != &local_248.field_2) {
              operator_delete(local_248._M_dataplus._M_p,
                              CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                                       local_248.field_2._M_local_buf[0]) + 1);
            }
            if (local_328 != (void *)0x0) {
              operator_delete(local_328,(long)local_318 - (long)local_328);
            }
            if (local_308.
                super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_308.
                              super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_308.
                                    super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_308.
                                    super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_228._M_dataplus._M_p != &local_228.field_2) {
              operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1
                             );
            }
            _Unwind_Resume(uVar14);
          }
          if (sVar20 == 0) {
            uVar19 = 0;
            uVar15 = 0;
            goto LAB_001dc12f;
          }
          pcVar2 = (local_370->_M_dataplus)._M_p;
          if (pcVar2[uVar19] != *(pdVar11->begin)._M_dataplus._M_p) goto LAB_001db911;
          uVar19 = uVar19 + 1;
          local_364 = (undefined4)CONCAT71((int7)((ulong)pcVar2 >> 8),1);
          pbVar10 = &local_228;
          sVar20 = local_228._M_string_length;
        }
        lVar21 = std::__cxx11::string::find
                           ((char *)local_370,(ulong)(pbVar10->_M_dataplus)._M_p,uVar19);
        if (lVar21 == -1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8._M_pod_data);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8._M_pod_data,"Unclosed tag at ",0x10);
          std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::operator=((string *)local_340,(string *)local_2f0);
          if ((undefined1 *)local_2f0._0_8_ != local_2f0 + 0x10) {
            operator_delete((void *)local_2f0._0_8_,CONCAT71(local_2f0._17_7_,local_2f0[0x10]) + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8._M_pod_data);
          std::ios_base::~ios_base((ios_base *)auStack_138);
          goto LAB_001dbfe8;
        }
        std::__cxx11::string::string
                  ((string *)local_1a8._M_pod_data,(string *)pbVar13,uVar19,lVar21 - uVar19);
        trim<std::__cxx11::string>(&local_360,(mustache *)local_1a8._M_pod_data,s);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_1a8._M_unused._0_8_ != &local_198) {
          operator_delete(local_1a8._M_unused._M_object,(ulong)(local_198._M_dataplus._M_p + 1));
        }
        local_2f0._0_8_ = local_2f0 + 0x10;
        local_2f0._8_8_ = 0;
        local_2f0[0x10] = '\0';
        local_2f0._32_8_ = local_2f0 + 0x30;
        local_2f0._40_8_ = 0;
        local_2f0[0x30] = '\0';
        local_2f0._64_4_ = text;
        local_288.
        super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_288.
        super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_288.
        super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_298 = (element_type *)0x0;
        _Stack_290._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_2f0._72_8_ = (element_type *)0x0;
        local_2f0._80_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_270 = (component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)0xffffffffffffffff;
        if ((local_360._M_string_length == 0) || (*local_360._M_dataplus._M_p != '=')) {
LAB_001dbac2:
          parse_tag_contents(local_258,local_364._0_1_,&local_360,
                             (mstch_tag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)(local_2f0 + 0x20));
LAB_001dbae1:
          local_270 = pcVar18;
          Catch::clara::std::
          vector<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::push_back(&local_308.
                       super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish[-1]->children,
                      (value_type *)local_2f0);
          local_378 = (pointer)(lVar21 + sVar20);
          bVar6 = true;
          if (local_2f0._64_4_ == section_begin_inverted) {
LAB_001dbb2f:
            local_1a8._M_unused._M_object =
                 (local_308.
                  super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1]->children).
                 super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1;
            std::
            vector<kainjow::mustache::component<std::__cxx11::string>*,std::allocator<kainjow::mustache::component<std::__cxx11::string>*>>
            ::emplace_back<kainjow::mustache::component<std::__cxx11::string>*>
                      ((vector<kainjow::mustache::component<std::__cxx11::string>*,std::allocator<kainjow::mustache::component<std::__cxx11::string>*>>
                        *)&local_308,
                       (component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        **)&local_1a8);
            if (iStack_320._M_current == local_318) {
              std::vector<unsigned_long,std::allocator<unsigned_long>>::
              _M_realloc_insert<unsigned_long_const&>
                        ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_328,
                         iStack_320,(unsigned_long *)&local_378);
            }
            else {
              *iStack_320._M_current = (unsigned_long)local_378;
              iStack_320._M_current = iStack_320._M_current + 1;
            }
          }
          else if (local_2f0._64_4_ == section_end) {
            if ((long)local_308.
                      super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_308.
                      super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
                      ._M_impl.super__Vector_impl_data._M_start == 8) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8._M_pod_data);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8._M_pod_data,"Unopened section \"",0x12);
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1a8._M_pod_data,(char *)local_2f0._32_8_,
                                   local_2f0._40_8_);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\" at ",5);
              std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
              std::__cxx11::stringbuf::str();
              std::__cxx11::string::operator=((string *)local_340,(string *)local_208);
              if (local_208[0] != local_1f8) {
                operator_delete(local_208[0],local_1f8[0] + 1);
              }
              goto LAB_001dbe20;
            }
            pcVar16 = local_308.
                      super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish[-1];
            pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      operator_new(0x20);
            std::__cxx11::string::substr((ulong)pbVar13,(ulong)local_370);
            std::__shared_ptr<std::__cxx11::string,(__gnu_cxx::_Lock_policy)2>::
            reset<std::__cxx11::string>
                      ((__shared_ptr<std::__cxx11::string,(__gnu_cxx::_Lock_policy)2> *)
                       &(pcVar16->tag).section_text,pbVar13);
            local_308.
            super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_308.
                 super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1;
            iStack_320._M_current = iStack_320._M_current + -1;
          }
          else if (local_2f0._64_4_ == section_begin) goto LAB_001dbb2f;
        }
        else {
          bVar6 = parse_set_delimiter_tag(local_258,&local_360,local_338);
          if (bVar6) {
            local_379 = delimiter_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::is_default(local_338);
            local_2f0._64_4_ = set_delimiter;
            pdVar11 = (delimiter_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)operator_new(0x40);
            pcVar4 = local_260;
            (pdVar11->begin)._M_dataplus._M_p = (pointer)&(pdVar11->begin).field_2;
            pcVar2 = (local_260->delim_set).begin._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)pdVar11,pcVar2,
                       pcVar2 + (local_260->delim_set).begin._M_string_length);
            (pdVar11->end)._M_dataplus._M_p = (pointer)&(pdVar11->end).field_2;
            pcVar2 = (pcVar4->delim_set).end._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&pdVar11->end,pcVar2,
                       pcVar2 + (pcVar4->delim_set).end._M_string_length);
            std::
            __shared_ptr<kainjow::mustache::delimiter_set<std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>
            ::reset<kainjow::mustache::delimiter_set<std::__cxx11::string>>
                      ((__shared_ptr<kainjow::mustache::delimiter_set<std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>
                        *)&local_298,pdVar11);
            if (local_2f0._64_4_ != set_delimiter) goto LAB_001dbac2;
            goto LAB_001dbae1;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8._M_pod_data);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8._M_pod_data,"Invalid set delimiter tag at ",0x1d);
          std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::operator=((string *)local_340,(string *)local_208);
          if (local_208[0] != local_1f8) {
            operator_delete(local_208[0],local_1f8[0] + 1);
          }
LAB_001dbe20:
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8._M_pod_data);
          std::ios_base::~ios_base((ios_base *)auStack_138);
          bVar6 = false;
        }
        Catch::clara::std::
        vector<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector(&local_288);
        if (_Stack_290._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (_Stack_290._M_pi);
        }
        pdVar11 = local_338;
        pbVar13 = local_370;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2f0._80_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2f0._80_8_);
        }
        if ((undefined1 *)local_2f0._32_8_ != local_2f0 + 0x30) {
          operator_delete((void *)local_2f0._32_8_,CONCAT71(local_2f0._49_7_,local_2f0[0x30]) + 1);
        }
        if ((undefined1 *)local_2f0._0_8_ != local_2f0 + 0x10) {
          operator_delete((void *)local_2f0._0_8_,CONCAT71(local_2f0._17_7_,local_2f0[0x10]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_360._M_dataplus._M_p != &local_360.field_2) {
          operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
        }
        ctx = local_260;
        if (!bVar6) goto LAB_001dbfe8;
      }
      else {
        for (; pbVar13 = local_370, pbVar17 != pbVar5; pbVar17 = pbVar17 + 1) {
          iVar7 = std::__cxx11::string::compare
                            ((ulong)local_370,(ulong)local_378,(string *)pbVar17->_M_string_length);
          if (iVar7 == 0) {
            parse::anon_class_24_3_f3e5c141::operator()(&local_1d8);
            pcVar18 = local_378;
            local_1a8._M_unused._M_object = &local_198;
            pcVar2 = (pbVar17->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1a8,pcVar2,pcVar2 + pbVar17->_M_string_length);
            local_198.field_2._M_allocated_capacity = (size_type)&local_178;
            local_198.field_2._8_8_ = 0;
            local_178._M_dataplus._M_p._0_1_ = 0;
            local_178.field_2._M_allocated_capacity =
                 local_178.field_2._M_allocated_capacity & 0xffffffff00000000;
            auStack_138._8_8_ = (pointer)0x0;
            local_140 = (undefined1  [8])0x0;
            auStack_138._0_8_ = (pointer)0x0;
            local_150 = 0;
            _Stack_148._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_178.field_2._8_8_ = 0;
            _Stack_158._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_128[0] = pcVar18;
            Catch::clara::std::
            vector<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::push_back(&local_308.
                         super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish[-1]->children,
                        (value_type *)&local_1a8);
            local_378 = (pointer)((long)&(local_378->text)._M_dataplus._M_p +
                                 pbVar17->_M_string_length);
            Catch::clara::std::
            vector<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::~vector((vector<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)local_140);
            if (_Stack_148._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (_Stack_148._M_pi);
            }
            pbVar13 = local_370;
            if (_Stack_158._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (_Stack_158._M_pi);
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_198.field_2._M_allocated_capacity != &local_178) {
              operator_delete((void *)local_198.field_2._M_allocated_capacity,
                              CONCAT71(local_178._M_dataplus._M_p._1_7_,
                                       local_178._M_dataplus._M_p._0_1_) + 1);
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_1a8._M_unused._0_8_ != &local_198) {
              operator_delete(local_1a8._M_unused._M_object,(ulong)(local_198._M_dataplus._M_p + 1))
              ;
            }
            goto LAB_001dbf3f;
          }
        }
        if (local_248._M_string_length == 0) {
          local_250 = local_378;
        }
        std::__cxx11::string::_M_replace_aux((ulong)&local_248,local_248._M_string_length,0,'\x01');
        local_378 = (pointer)((long)&(local_378->text)._M_dataplus._M_p + 1);
      }
LAB_001dbf3f:
    } while (local_378 != local_330);
  }
  parse::anon_class_24_3_f3e5c141::operator()(&local_1d8);
  local_1a8._8_8_ = 0;
  local_1a8._M_unused._M_object = local_340;
  local_198._M_string_length =
       (size_type)
       Catch::clara::std::
       _Function_handler<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::walk_control_(kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kainjow[P]Mustache/mustache.hpp:786:38)>
       ::_M_invoke;
  local_198._M_dataplus._M_p =
       (pointer)Catch::clara::std::
                _Function_handler<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::walk_control_(kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kainjow[P]Mustache/mustache.hpp:786:38)>
                ::_M_manager;
  pcVar18 = (local_1e8->children).
            super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pcVar3 = (local_1e8->children).
           super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pcVar18 != pcVar3) {
    do {
      wVar8 = component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::walk(pcVar18,(walk_callback *)&local_1a8);
      if (wVar8 != walk) break;
      pcVar18 = pcVar18 + 1;
    } while (pcVar18 != pcVar3);
    if ((code *)local_198._M_dataplus._M_p == (code *)0x0) goto LAB_001dbfe8;
  }
  (*(code *)local_198._M_dataplus._M_p)(&local_1a8,&local_1a8,3);
LAB_001dbfe8:
  Catch::clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,
                    CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                             local_248.field_2._M_local_buf[0]) + 1);
  }
  if (local_328 != (void *)0x0) {
    operator_delete(local_328,(long)local_318 - (long)local_328);
  }
  if (local_308.
      super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_308.
                    super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_308.
                          super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_308.
                          super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void parse(const string_type& input, context_internal<string_type>& ctx, component<string_type>& root_component, string_type& error_message) const {
        using string_size_type = typename string_type::size_type;
        using streamstring = std::basic_ostringstream<typename string_type::value_type>;

        const string_type brace_delimiter_end_unescaped(3, '}');
        const string_size_type input_size{input.size()};

        bool current_delimiter_is_brace{ctx.delim_set.is_default()};

        std::vector<component<string_type>*> sections{&root_component};
        std::vector<string_size_type> section_starts;
        string_type current_text;
        string_size_type current_text_position = string_type::npos;

        current_text.reserve(input_size);

        const auto process_current_text = [&current_text, &current_text_position, &sections]() {
            if (!current_text.empty()) {
                const component<string_type> comp{current_text, current_text_position};
                sections.back()->children.push_back(comp);
                current_text.clear();
                current_text_position = string_type::npos;
            }
        };

        const std::vector<string_type> whitespace{
            string_type(1, '\r') + string_type(1, '\n'),
            string_type(1, '\n'),
            string_type(1, '\r'),
            string_type(1, ' '),
            string_type(1, '\t'),
        };

        for (string_size_type input_position = 0; input_position != input_size;) {
            bool parse_tag = false;

            if (input.compare(input_position, ctx.delim_set.begin.size(), ctx.delim_set.begin) == 0) {
                process_current_text();

                // Tag start delimiter
                parse_tag = true;
            } else {
                bool parsed_whitespace = false;
                for (const auto& whitespace_text : whitespace) {
                    if (input.compare(input_position, whitespace_text.size(), whitespace_text) == 0) {
                        process_current_text();

                        const component<string_type> comp{whitespace_text, input_position};
                        sections.back()->children.push_back(comp);
                        input_position += whitespace_text.size();

                        parsed_whitespace = true;
                        break;
                    }
                }

                if (!parsed_whitespace) {
                    if (current_text.empty()) {
                        current_text_position = input_position;
                    }
                    current_text.append(1, input[input_position]);
                    input_position++;
                }
            }

            if (!parse_tag) {
                continue;
            }

            // Find the next tag start delimiter
            const string_size_type tag_location_start = input_position;

            // Find the next tag end delimiter
            string_size_type tag_contents_location{tag_location_start + ctx.delim_set.begin.size()};
            const bool tag_is_unescaped_var{current_delimiter_is_brace && tag_location_start != (input_size - 2) && input.at(tag_contents_location) == ctx.delim_set.begin.at(0)};
            const string_type& current_tag_delimiter_end{tag_is_unescaped_var ? brace_delimiter_end_unescaped : ctx.delim_set.end};
            const auto current_tag_delimiter_end_size = current_tag_delimiter_end.size();
            if (tag_is_unescaped_var) {
                ++tag_contents_location;
            }
            const string_size_type tag_location_end{input.find(current_tag_delimiter_end, tag_contents_location)};
            if (tag_location_end == string_type::npos) {
                streamstring ss;
                ss << "Unclosed tag at " << tag_location_start;
                error_message.assign(ss.str());
                return;
            }

            // Parse tag
            const string_type tag_contents{trim(string_type{input, tag_contents_location, tag_location_end - tag_contents_location})};
            component<string_type> comp;
            if (!tag_contents.empty() && tag_contents[0] == '=') {
                if (!parse_set_delimiter_tag(tag_contents, ctx.delim_set)) {
                    streamstring ss;
                    ss << "Invalid set delimiter tag at " << tag_location_start;
                    error_message.assign(ss.str());
                    return;
                }
                current_delimiter_is_brace = ctx.delim_set.is_default();
                comp.tag.type = tag_type::set_delimiter;
                comp.tag.delim_set.reset(new delimiter_set<string_type>(ctx.delim_set));
            }
            if (comp.tag.type != tag_type::set_delimiter) {
                parse_tag_contents(tag_is_unescaped_var, tag_contents, comp.tag);
            }
            comp.position = tag_location_start;
            sections.back()->children.push_back(comp);

            // Start next search after this tag
            input_position = tag_location_end + current_tag_delimiter_end_size;

            // Push or pop sections
            if (comp.tag.is_section_begin()) {
                sections.push_back(&sections.back()->children.back());
                section_starts.push_back(input_position);
            } else if (comp.tag.is_section_end()) {
                if (sections.size() == 1) {
                    streamstring ss;
                    ss << "Unopened section \"" << comp.tag.name << "\" at " << comp.position;
                    error_message.assign(ss.str());
                    return;
                }
                sections.back()->tag.section_text.reset(new string_type(input.substr(section_starts.back(), tag_location_start - section_starts.back())));
                sections.pop_back();
                section_starts.pop_back();
            }
        }

        process_current_text();

        // Check for sections without an ending tag
        root_component.walk_children([&error_message](component<string_type>& comp) -> typename component<string_type>::walk_control {
            if (!comp.tag.is_section_begin()) {
                return component<string_type>::walk_control::walk;
            }
            if (comp.children.empty() || !comp.children.back().tag.is_section_end() || comp.children.back().tag.name != comp.tag.name) {
                streamstring ss;
                ss << "Unclosed section \"" << comp.tag.name << "\" at " << comp.position;
                error_message.assign(ss.str());
                return component<string_type>::walk_control::stop;
            }
            comp.children.pop_back(); // remove now useless end section component
            return component<string_type>::walk_control::walk;
        });
        if (!error_message.empty()) {
            return;
        }
    }